

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          StringTree *params_1,StringTree *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,StringTree *params_8,
          ArrayPtr<const_char> *params_9,ArrayPtr<const_char> *params_10,
          ArrayPtr<const_char> *params_11,StringTree *params_12,ArrayPtr<const_char> *params_13,
          ArrayPtr<const_char> *params_14,ArrayPtr<const_char> *params_15,StringTree *params_16,
          ArrayPtr<const_char> *params_17,ArrayPtr<const_char> *params_18,
          ArrayPtr<const_char> *params_19,ArrayPtr<const_char> *params_20,
          ArrayPtr<const_char> *params_21,StringTree *params_22)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *__n;
  size_t sVar3;
  long lVar4;
  size_t result_2;
  char *pcVar5;
  String local_158;
  char *local_138 [2];
  size_t sStack_128;
  char *local_120;
  size_t sStack_118;
  size_t local_110;
  size_t sStack_108;
  size_t local_100;
  char *local_f8;
  char *local_f0;
  size_t sStack_e8;
  size_t local_e0;
  char *local_d8;
  char *local_d0;
  size_t sStack_c8;
  size_t local_c0;
  char *local_b8;
  char *local_b0;
  size_t sStack_a8;
  size_t local_a0;
  size_t sStack_98;
  size_t local_90;
  char *local_88;
  StringTree *local_80;
  StringTree *local_78;
  StringTree *local_70;
  StringTree *local_68;
  ArrayPtr<const_char> *local_60;
  size_t local_58;
  size_t local_50;
  size_t local_48;
  char *local_40;
  char *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_38 = (this->text).content.ptr;
  local_138[0] = local_38;
  local_138[1] = params->ptr;
  sStack_128 = params_1->size_;
  local_40 = (params_2->text).content.ptr;
  local_120 = local_40;
  local_48 = params_3->size_;
  sStack_118 = local_48;
  local_50 = params_4->size_;
  local_110 = local_50;
  local_58 = params_5->size_;
  sStack_108 = local_58;
  local_100 = params_6->size_;
  local_f8 = params_7->ptr;
  local_f0 = (params_8->text).content.ptr;
  sStack_e8 = params_9->size_;
  local_e0 = params_10->size_;
  local_d8 = params_11->ptr;
  local_d0 = (params_12->text).content.ptr;
  sStack_c8 = params_13->size_;
  local_c0 = params_14->size_;
  local_b8 = params_15->ptr;
  local_b0 = (params_16->text).content.ptr;
  sStack_a8 = params_17->size_;
  local_a0 = params_18->size_;
  sStack_98 = params_19->size_;
  local_90 = params_20->size_;
  local_88 = params_21->ptr;
  sVar3 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_138 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xb8);
  __return_storage_ptr__->size_ = sVar3;
  local_138[1] = (char *)0x0;
  sStack_128 = 0;
  sVar3 = 0;
  local_f8 = (char *)0x0;
  local_d8 = (char *)0x0;
  local_b8 = (char *)0x0;
  local_88 = (char *)0x0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_138 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xb8);
  local_80 = this;
  local_78 = (StringTree *)params;
  local_70 = params_1;
  local_68 = params_2;
  local_60 = params_3;
  heapString(&local_158,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_158.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_158.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_158.content.disposer;
  sVar3 = 0;
  local_138[0] = (char *)0x0;
  local_138[1] = (char *)0x1;
  sStack_128 = 1;
  local_120 = (char *)0x0;
  sStack_118 = 0;
  local_110 = 0;
  sStack_108 = 0;
  local_100 = 0;
  local_f8 = (char *)0x1;
  local_f0 = (char *)0x0;
  sStack_e8 = 0;
  local_e0 = 0;
  local_d8 = (char *)0x1;
  local_d0 = (char *)0x0;
  sStack_c8 = 0;
  local_c0 = 0;
  local_b8 = (char *)0x1;
  local_b0 = (char *)0x0;
  sStack_a8 = 0;
  local_a0 = 0;
  sStack_98 = 0;
  local_90 = 0;
  local_88 = (char *)0x1;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)local_138 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xb8);
  local_158.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_158.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_158.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_158.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_158.content.size_;
  (__return_storage_ptr__->branches).disposer = local_158.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  __n = (local_80->text).content.ptr;
  if (__n != (char *)0x0) {
    memcpy(pcVar5,(void *)local_80->size_,(size_t)__n);
    pcVar5 = pcVar5 + (long)__n;
  }
  fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
            (__return_storage_ptr__,pcVar5,0,local_78,local_70,(ArrayPtr<const_char> *)local_68,
             local_60,params_4,params_5,params_6,(StringTree *)params_7,
             (ArrayPtr<const_char> *)params_8,params_9,params_10,(StringTree *)params_11,
             (ArrayPtr<const_char> *)params_12,params_13,params_14,(StringTree *)params_15,
             (ArrayPtr<const_char> *)params_16,params_17,params_18,params_19,params_20,
             (StringTree *)params_21);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}